

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 HashmapInsert(jx9_hashmap *pMap,jx9_value *pKey,jx9_value *pVal)

{
  char cVar1;
  sxu32 nKeyLen;
  uint uVar2;
  jx9_vm *pjVar3;
  sxi32 sVar4;
  ushort **ppuVar5;
  long lVar6;
  jx9_value *pDest;
  char *pcVar7;
  char *pcVar8;
  jx9_hashmap_node *pNode;
  jx9_hashmap_node *local_38;
  
  local_38 = (jx9_hashmap_node *)0x0;
  if (((pKey != (jx9_value *)0x0) && (pMap->nEntry == 0)) && ((pKey->iFlags & 1) != 0)) {
    *(byte *)&pMap->iFlags = (byte)pMap->iFlags | 1;
  }
  if (pKey == (jx9_value *)0x0) {
LAB_0011ae83:
    pKey = (jx9_value *)0x0;
  }
  else if ((pKey->iFlags & 0x141U) != 0) {
    if ((pKey->iFlags & 1U) == 0) {
      jx9MemObjToString(pKey);
    }
    nKeyLen = (pKey->sBlob).nByte;
    if (nKeyLen == 0) goto LAB_0011ae83;
    pcVar7 = (char *)(pKey->sBlob).pBlob;
    uVar2 = (pKey->sBlob).nByte;
    if ((1 < (int)uVar2) && (*pcVar7 == '0')) {
LAB_0011ae51:
      sVar4 = HashmapLookupBlobKey(pMap,(pKey->sBlob).pBlob,nKeyLen,&local_38);
      if (sVar4 != 0) {
        sVar4 = HashmapInsertBlobKey(pMap,(pKey->sBlob).pBlob,(pKey->sBlob).nByte,pVal);
        return sVar4;
      }
      pjVar3 = pMap->pVm;
      if (local_38->nValIdx < (pjVar3->aMemObj).nUsed) {
        pDest = (jx9_value *)
                ((ulong)(local_38->nValIdx * (pjVar3->aMemObj).eSize) +
                (long)(pjVar3->aMemObj).pBase);
      }
      else {
        pDest = (jx9_value *)0x0;
      }
      goto joined_r0x0011af9c;
    }
    pcVar8 = pcVar7 + uVar2;
    if ((*pcVar7 == '-') || (*pcVar7 == '+')) {
      pcVar7 = pcVar7 + (1 < uVar2);
    }
    for (; pcVar7 < pcVar8; pcVar7 = pcVar7 + 1) {
      cVar1 = *pcVar7;
      if ((0xffffffffffffffbf < (ulong)(long)cVar1) ||
         (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 8) == 0))
      goto LAB_0011ae51;
    }
  }
  if (pKey == (jx9_value *)0x0) {
    sVar4 = HashmapInsertIntKey(pMap,pMap->iNextIdx,pVal);
    if (sVar4 != 0) {
      return sVar4;
    }
    pMap->iNextIdx = pMap->iNextIdx + 1;
    return 0;
  }
  if ((pKey->iFlags & 2) == 0) {
    jx9MemObjToInteger(pKey);
  }
  sVar4 = HashmapLookupIntKey(pMap,(pKey->x).iVal,&local_38);
  if (sVar4 != 0) {
    sVar4 = HashmapInsertIntKey(pMap,(pKey->x).iVal,pVal);
    if (sVar4 != 0) {
      return sVar4;
    }
    lVar6 = (pKey->x).iVal;
    if (lVar6 < pMap->iNextIdx) {
      return 0;
    }
    while( true ) {
      pMap->iNextIdx = lVar6 + 1;
      sVar4 = HashmapLookupIntKey(pMap,lVar6 + 1,(jx9_hashmap_node **)0x0);
      if (sVar4 != 0) break;
      lVar6 = pMap->iNextIdx;
    }
    return 0;
  }
  pjVar3 = pMap->pVm;
  if (local_38->nValIdx < (pjVar3->aMemObj).nUsed) {
    pDest = (jx9_value *)
            ((ulong)(local_38->nValIdx * (pjVar3->aMemObj).eSize) + (long)(pjVar3->aMemObj).pBase);
  }
  else {
    pDest = (jx9_value *)0x0;
  }
joined_r0x0011af9c:
  if (pDest != (jx9_value *)0x0) {
    if (pVal == (jx9_value *)0x0) {
      jx9MemObjRelease(pDest);
    }
    else {
      jx9MemObjStore(pVal,pDest);
    }
  }
  return 0;
}

Assistant:

static sxi32 HashmapInsert(
	jx9_hashmap *pMap, /* Target hashmap */
	jx9_value *pKey,   /* Lookup key  */
	jx9_value *pVal    /* Node value */
	)
{
	jx9_hashmap_node *pNode = 0;
	sxi32 rc = SXRET_OK;
	if( pMap->nEntry < 1 && pKey && (pKey->iFlags & MEMOBJ_STRING) ){
		pMap->iFlags |= HASHMAP_JSON_OBJECT;
	}
	if( pKey && (pKey->iFlags & (MEMOBJ_STRING|MEMOBJ_HASHMAP|MEMOBJ_RES)) ){
		if( (pKey->iFlags & MEMOBJ_STRING) == 0 ){
			/* Force a string cast */
			jx9MemObjToString(&(*pKey));
		}
		if( SyBlobLength(&pKey->sBlob) < 1 || HashmapIsIntKey(&pKey->sBlob) ){
			if(SyBlobLength(&pKey->sBlob) < 1){
				/* Automatic index assign */
				pKey = 0;
			}
			goto IntKey;
		}
		if( SXRET_OK == HashmapLookupBlobKey(&(*pMap), SyBlobData(&pKey->sBlob), 
			SyBlobLength(&pKey->sBlob), &pNode) ){
				/* Overwrite the old value */
				jx9_value *pElem;
				pElem = (jx9_value *)SySetAt(&pMap->pVm->aMemObj, pNode->nValIdx);
				if( pElem ){
					if( pVal ){
						jx9MemObjStore(pVal, pElem);
					}else{
						/* Nullify the entry */
						jx9MemObjToNull(pElem);
					}
				}
				return SXRET_OK;
		}
		/* Perform a blob-key insertion */
		rc = HashmapInsertBlobKey(&(*pMap),SyBlobData(&pKey->sBlob),SyBlobLength(&pKey->sBlob),&(*pVal));
		return rc;
	}
IntKey:
	if( pKey ){
		if((pKey->iFlags & MEMOBJ_INT) == 0 ){
			/* Force an integer cast */
			jx9MemObjToInteger(pKey);
		}
		if( SXRET_OK == HashmapLookupIntKey(&(*pMap), pKey->x.iVal, &pNode) ){
			/* Overwrite the old value */
			jx9_value *pElem;
			pElem = (jx9_value *)SySetAt(&pMap->pVm->aMemObj, pNode->nValIdx);
			if( pElem ){
				if( pVal ){
					jx9MemObjStore(pVal, pElem);
				}else{
					/* Nullify the entry */
					jx9MemObjToNull(pElem);
				}
			}
			return SXRET_OK;
		}
		/* Perform a 64-bit-int-key insertion */
		rc = HashmapInsertIntKey(&(*pMap), pKey->x.iVal, &(*pVal));
		if( rc == SXRET_OK ){
			if( pKey->x.iVal >= pMap->iNextIdx ){
				/* Increment the automatic index */ 
				pMap->iNextIdx = pKey->x.iVal + 1;
				/* Make sure the automatic index is not reserved */
				while( SXRET_OK == HashmapLookupIntKey(&(*pMap), pMap->iNextIdx, 0) ){
					pMap->iNextIdx++;
				}
			}
		}
	}else{
		/* Assign an automatic index */
		rc = HashmapInsertIntKey(&(*pMap),pMap->iNextIdx,&(*pVal));
		if( rc == SXRET_OK ){
			++pMap->iNextIdx;
		}
	}
	/* Insertion result */
	return rc;
}